

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void expfilter(double *sig,int N,double alpha,double *oup)

{
  double beta;
  int i;
  double *oup_local;
  double alpha_local;
  int N_local;
  double *sig_local;
  
  *oup = *sig;
  for (beta._4_4_ = 1; beta._4_4_ < N; beta._4_4_ = beta._4_4_ + 1) {
    oup[beta._4_4_] = alpha * sig[beta._4_4_] + (1.0 - alpha) * oup[beta._4_4_ + -1];
  }
  return;
}

Assistant:

void expfilter(double *sig,int N, double alpha,double *oup) {
	int i;
	double beta;
	
	/* alpha accepts values between 0 and 1.
	 * No error check is implemented presently
	 * so make sure that the correct value of 
	 * alpha is entered.  
	 */ 
	beta = 1.0 - alpha;
	
	oup[0] = sig[0];
	
	for (i = 1; i < N; ++i) {
		oup[i] = alpha * sig[i] + beta * oup[i-1];
	}
}